

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# publisher.cc
# Opt level: O3

void __thiscall Publisher::setSendBuffer(Publisher *this,int size)

{
  int iVar1;
  char *pcVar2;
  runtime_error *this_00;
  stringstream ss;
  int local_1c4;
  string local_1c0 [32];
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  local_1c4 = size;
  iVar1 = nn_setsockopt(this->fd_,0,2,&local_1c4,4);
  if (-1 < iVar1) {
    return;
  }
  nn_close(this->fd_);
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"nn_setsockopt: ",0xf);
  iVar1 = nn_errno();
  pcVar2 = nn_strerror(iVar1);
  std::operator<<(local_190,pcVar2);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this_00,local_1c0);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Publisher::setSendBuffer(int size) {
  int rv = nn_setsockopt(fd_, NN_SOL_SOCKET, NN_SNDBUF, &size, sizeof(size));
  if (rv < 0) {
    nn_close(fd_);
    std::stringstream ss;
    ss << "nn_setsockopt: " << nn_strerror(nn_errno());
    throw std::runtime_error(ss.str());
  }
}